

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cpp
# Opt level: O1

GlobRank __thiscall
slang::svGlobInternal
          (slang *this,path *basePath,string_view pattern,GlobMode mode,
          SmallVector<std::filesystem::__cxx11::path,_2UL> *results,bool *anyWildcards)

{
  undefined1 *puVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  bool bVar6;
  uint uVar7;
  path *dir_1;
  pointer ppVar8;
  short *psVar9;
  path *path;
  path *ppVar10;
  undefined4 in_register_00000084;
  SmallVector<std::filesystem::__cxx11::path,_2UL> *results_00;
  SmallVector<std::filesystem::__cxx11::path,_2UL> *pSVar11;
  path *dir;
  GlobRank unaff_R13D;
  path *ppVar12;
  long lVar13;
  bool bVar14;
  bool bVar15;
  string_view pattern_00;
  string_view pattern_01;
  string_view pattern_02;
  string_view pattern_03;
  path currPath;
  SmallVector<std::filesystem::__cxx11::path,_2UL> dirs;
  flat_hash_set<std::string> visited;
  undefined4 in_stack_fffffffffffffed8;
  path local_f0;
  SmallVector<std::filesystem::__cxx11::path,_2UL> local_c8;
  table_core<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  results_00 = (SmallVector<std::filesystem::__cxx11::path,_2UL> *)
               CONCAT44(in_register_00000084,mode);
  uVar7 = (uint)pattern._M_str;
  pSVar11 = results;
  std::filesystem::__cxx11::path::path(&local_f0,(path *)this);
  psVar9 = (short *)pattern._M_len;
  ppVar12 = basePath;
  while( true ) {
    if (ppVar12 == (path *)0x0) {
      if (uVar7 == 0) {
        unaff_R13D = Directory;
        iterDirectory(&local_f0,results_00,Files);
      }
      else {
        local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ =
             (pointer)((ulong)local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ &
                      0xffffffff00000000);
        local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.len =
             std::_V2::system_category();
        cVar4 = std::filesystem::status(&local_f0,(error_code *)&local_c8);
        if (cVar4 == '\x02') {
          SmallVectorBase<std::filesystem::__cxx11::path>::
          emplace_back<std::filesystem::__cxx11::path>
                    ((SmallVectorBase<std::filesystem::__cxx11::path> *)results_00,&local_f0);
        }
        unaff_R13D = Directory;
        if ((basePath != (path *)0x0) &&
           ((basePath != (path *)0x1 || ((char)*(short *)pattern._M_len != '/')))) {
          unaff_R13D = SimpleName;
        }
      }
      goto LAB_00228795;
    }
    if (((path *)0x2 < ppVar12) && ((char)psVar9[1] == '.' && *psVar9 == 0x2e2e)) break;
    bVar6 = false;
    ppVar10 = (path *)0x0;
    bVar2 = false;
    do {
      bVar3 = bVar2;
      cVar4 = *(char *)((long)psVar9 + (long)ppVar10);
      bVar14 = cVar4 == '?';
      bVar15 = cVar4 == '*';
      bVar2 = (bool)((bVar15 || bVar14) | bVar3);
      if (cVar4 == '/') {
        in_stack_fffffffffffffed8 = CONCAT13(0x2f,(int3)in_stack_fffffffffffffed8);
        puVar1 = (undefined1 *)((long)&(ppVar10->_M_pathname)._M_dataplus._M_p + 1);
        path = ppVar10;
        if (ppVar12 < ppVar10) {
          path = ppVar12;
        }
        if (ppVar12 <= ppVar10) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     puVar1,ppVar12);
        }
        ppVar12 = (path *)((long)ppVar12 - (long)puVar1);
        if (bVar2) {
          local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ =
               (pointer)local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.firstElement;
          local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.len = 0;
          local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.cap = 2;
          pattern_00._M_str = (char *)&local_c8;
          pattern_00._M_len = (size_t)psVar9;
          globDir((slang *)&local_f0,path,pattern_00,
                  (SmallVector<std::filesystem::__cxx11::path,_2UL> *)0x1,(GlobMode)pSVar11);
          if (local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.len == 0) {
            unaff_R13D = Directory;
          }
          else {
            lVar13 = local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.len * 0x28;
            ppVar8 = local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_;
            do {
              pattern_01._M_str._0_4_ = uVar7;
              pattern_01._M_len = (size_t)(puVar1 + (long)psVar9);
              pattern_01._M_str._4_4_ = 0;
              path = ppVar12;
              pSVar11 = results;
              unaff_R13D = svGlobInternal((slang *)ppVar8,ppVar12,pattern_01,mode,results,
                                          (bool *)CONCAT44(uVar7,in_stack_fffffffffffffed8));
              ppVar8 = ppVar8 + 1;
              lVar13 = lVar13 + -0x28;
            } while (lVar13 != 0);
          }
          *(undefined1 *)&(results->super_SmallVectorBase<std::filesystem::__cxx11::path>).data_ = 1
          ;
          SmallVectorBase<std::filesystem::__cxx11::path>::cleanup
                    (&local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>,
                     (EVP_PKEY_CTX *)path);
          iVar5 = 1;
        }
        else {
          std::filesystem::__cxx11::path::_M_append(&local_f0,path,psVar9);
          iVar5 = 6;
          bVar6 = true;
        }
        cVar4 = (char)((uint)in_stack_fffffffffffffed8 >> 0x18);
        psVar9 = (short *)(puVar1 + (long)psVar9);
      }
      else {
        iVar5 = 0;
      }
      if (cVar4 == '/') goto LAB_00228560;
      ppVar10 = (path *)((long)&(ppVar10->_M_pathname)._M_dataplus._M_p + 1);
    } while (ppVar10 < ppVar12);
    iVar5 = 6;
LAB_00228560:
    if (iVar5 == 6) {
      bVar2 = true;
      if (!bVar6) {
        if ((bVar15 || bVar14) || bVar3) {
          pattern_02._M_str = (char *)results_00;
          pattern_02._M_len = (size_t)psVar9;
          globDir((slang *)&local_f0,ppVar12,pattern_02,
                  (SmallVector<std::filesystem::__cxx11::path,_2UL> *)(ulong)uVar7,(GlobMode)pSVar11
                 );
          *(undefined1 *)&(results->super_SmallVectorBase<std::filesystem::__cxx11::path>).data_ = 1
          ;
          unaff_R13D = WildcardName;
        }
        else {
          local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ =
               (pointer)((ulong)local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_
                        & 0xffffffff00000000);
          local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.len =
               std::_V2::system_category();
          std::filesystem::__cxx11::path::_M_append(&local_f0,ppVar12,psVar9);
          if (uVar7 == 1) {
LAB_002285e9:
            cVar4 = std::filesystem::status(&local_f0,(error_code *)&local_c8);
            if (cVar4 == '\x02') {
LAB_002285fa:
              SmallVectorBase<std::filesystem::__cxx11::path>::
              emplace_back<std::filesystem::__cxx11::path>
                        ((SmallVectorBase<std::filesystem::__cxx11::path> *)results_00,&local_f0);
            }
          }
          else if (uVar7 == 0) {
            cVar4 = std::filesystem::status(&local_f0,(error_code *)&local_c8);
            if (cVar4 == '\x01') goto LAB_002285fa;
            if (uVar7 == 1) goto LAB_002285e9;
          }
          unaff_R13D = SimpleName;
        }
        goto LAB_0022860d;
      }
    }
    else {
LAB_0022860d:
      bVar2 = false;
    }
    if (!bVar2) goto LAB_00228795;
  }
  local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ =
       (pointer)local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.firstElement;
  local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.len = 0;
  local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.cap = 2;
  local_60.arrays.groups_size_index = 0x3f;
  local_60.arrays.groups_size_mask = 1;
  local_60.arrays.elements_ = (value_type_pointer)0x0;
  local_60.arrays.groups_ =
       (group_type_pointer)
       boost::unordered::detail::foa::
       dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
       ::storage;
  local_60.size_ctrl.ml = 0;
  local_60.size_ctrl.size = 0;
  iterDirectoriesRecursive(&local_f0,&local_c8,(flat_hash_set<std::string> *)&local_60);
  ppVar10 = &local_f0;
  SmallVectorBase<std::filesystem::__cxx11::path>::emplace_back<std::filesystem::__cxx11::path>
            (&local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>,ppVar10);
  if (ppVar12 < (path *)0x3) {
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",3,
               ppVar12);
  }
  if (local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.len == 0) {
    unaff_R13D = Directory;
  }
  else {
    ppVar12 = (path *)((long)&ppVar12[-1]._M_cmpts._M_impl._M_t.
                              super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                              .
                              super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                      + 5);
    lVar13 = local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.len * 0x28;
    ppVar8 = local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_;
    do {
      pattern_03._M_str._0_4_ = uVar7;
      pattern_03._M_len = (size_t)((long)psVar9 + 3);
      pattern_03._M_str._4_4_ = 0;
      ppVar10 = ppVar12;
      unaff_R13D = svGlobInternal((slang *)ppVar8,ppVar12,pattern_03,mode,results,
                                  (bool *)CONCAT44(uVar7,in_stack_fffffffffffffed8));
      ppVar8 = ppVar8 + 1;
      lVar13 = lVar13 + -0x28;
    } while (lVar13 != 0);
  }
  *(undefined1 *)&(results->super_SmallVectorBase<std::filesystem::__cxx11::path>).data_ = 1;
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~table_core(&local_60);
  SmallVectorBase<std::filesystem::__cxx11::path>::cleanup
            (&local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>,(EVP_PKEY_CTX *)ppVar10
            );
LAB_00228795:
  std::filesystem::__cxx11::path::~path(&local_f0);
  return unaff_R13D;
}

Assistant:

GlobRank svGlobInternal(const fs::path& basePath, std::string_view pattern, GlobMode mode,
                        SmallVector<fs::path>& results, bool& anyWildcards) {
    // Parse the pattern. Consume directories in chunks until
    // we find one that has wildcards for us to handle.
    auto currPath = basePath;
    const auto originalPattern = pattern;
    while (!pattern.empty()) {
        // The '...' pattern only applies at the start of a segment,
        // and means to recursively pull all directories.
        if (pattern.starts_with("..."sv)) {
            SmallVector<fs::path> dirs;
            flat_hash_set<std::string> visited;
            iterDirectoriesRecursive(currPath, dirs, visited);
            dirs.emplace_back(std::move(currPath));

            pattern = pattern.substr(3);

            auto rank = GlobRank::Directory;
            for (auto& dir : dirs)
                rank = svGlobInternal(dir, pattern, mode, results, anyWildcards);

            anyWildcards = true;
            return rank;
        }

        bool hasWildcards = false;
        bool foundDir = false;
        for (size_t i = 0; i < pattern.size(); i++) {
            char c = pattern[i];
            hasWildcards |= (c == '?' || c == '*');
            if (c == fs::path::preferred_separator) {
                auto subPattern = pattern.substr(0, i);
                pattern = pattern.substr(i + 1);

                // If this directory entry had wildcards we need to expand them
                // and recursively search within each expanded directory.
                if (hasWildcards) {
                    SmallVector<fs::path> dirs;
                    globDir(currPath, subPattern, dirs, GlobMode::Directories);

                    auto rank = GlobRank::Directory;
                    for (auto& dir : dirs)
                        rank = svGlobInternal(dir, pattern, mode, results, anyWildcards);

                    anyWildcards = true;
                    return rank;
                }

                // Otherwise just record this directory and move on to the next.
                foundDir = true;
                currPath /= subPattern;
                break;
            }
        }

        // We didn't find a directory separator, so we're going to consume
        // the remainder of the pattern and search for files/directories with
        // that pattern.
        if (!foundDir) {
            if (hasWildcards) {
                globDir(currPath, pattern, results, mode);
                anyWildcards = true;
                return GlobRank::WildcardName;
            }

            // Check for an exact match and add the target if we find it.
            std::error_code ec;
            currPath /= pattern;

            if ((mode == GlobMode::Files && fs::is_regular_file(currPath, ec)) ||
                (mode == GlobMode::Directories && fs::is_directory(currPath, ec))) {
                results.emplace_back(std::move(currPath));
            }

            return GlobRank::SimpleName;
        }
    }

    // If we reach this point, we either had an empty pattern to
    // begin with or we consumed the whole pattern and it had a trailing
    // directory separator. If we are searching for files we want to include
    // all files underneath the directory pointed to by currPath, and if
    // we're searching for directories we'll just take this directory.
    if (mode == GlobMode::Files) {
        iterDirectory(currPath, results, GlobMode::Files);
        return GlobRank::Directory;
    }
    else {
        std::error_code ec;
        if (fs::is_directory(currPath, ec))
            results.emplace_back(std::move(currPath));

        if (originalPattern.empty() ||
            (originalPattern.size() == 1 && originalPattern[0] == fs::path::preferred_separator)) {
            return GlobRank::Directory;
        }
        else {
            return GlobRank::SimpleName;
        }
    }
}